

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_> obj;
  code *local_60;
  long local_30 [6];
  
  anon_unknown.dwarf_70180c::CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_>::
  CATCH2_INTERNAL_TEMPLATE_TEST_156
            ((CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_> *)0x91b53d);
  local_60 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_30 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_60 & 1) != 0) {
    local_60 = *(code **)(local_60 + *plVar1 + -1);
  }
  (*local_60)(plVar1);
  anon_unknown.dwarf_70180c::CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_>::
  ~CATCH2_INTERNAL_TEMPLATE_TEST_156
            ((CATCH2_INTERNAL_TEMPLATE_TEST_156<slang::SmallVector<int,_3UL>_> *)0x91b5a4);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }